

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O0

cs_err X86_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  X86_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = X86_Intel_printInst;
  *(undefined4 *)(in_RDI + 0x68) = 1;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(code **)(in_RDI + 0x18) = X86_getInstruction;
  *(code **)(in_RDI + 0x28) = X86_reg_name;
  *(code **)(in_RDI + 0x40) = X86_get_insn_id;
  *(code **)(in_RDI + 0x30) = X86_insn_name;
  *(code **)(in_RDI + 0x38) = X86_group_name;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(code **)(in_RDI + 0xa8) = X86_reg_access;
  if (*(int *)(in_RDI + 4) == 8) {
    *(uint8_t **)(in_RDI + 0xa0) = "";
  }
  else {
    *(uint8_t **)(in_RDI + 0xa0) = "";
  }
  return CS_ERR_OK;
}

Assistant:

cs_err X86_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	X86_init(mri);

	// by default, we use Intel syntax
	ud->printer = X86_Intel_printInst;
	ud->syntax = CS_OPT_SYNTAX_INTEL;
	ud->printer_info = mri;
	ud->disasm = X86_getInstruction;
	ud->reg_name = X86_reg_name;
	ud->insn_id = X86_get_insn_id;
	ud->insn_name = X86_insn_name;
	ud->group_name = X86_group_name;
	ud->post_printer = NULL;;
#ifndef CAPSTONE_DIET
	ud->reg_access = X86_reg_access;
#endif

	if (ud->mode == CS_MODE_64)
		ud->regsize_map = regsize_map_64;
	else
		ud->regsize_map = regsize_map_32;

	return CS_ERR_OK;
}